

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags(void)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiWindow *potential_parent;
  bool local_3e;
  bool local_3d;
  byte local_3c;
  byte local_3a;
  byte local_39;
  ImGuiWindow *local_38;
  ImGuiWindow *local_30;
  int local_24;
  bool mouse_dragging_extern_payload;
  bool mouse_avail_to_imgui;
  int i;
  bool mouse_any_down;
  int mouse_earliest_button_down;
  ImGuiWindow *modal_window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if ((GImGui->MovingWindow == (ImGuiWindow *)0x0) || ((GImGui->MovingWindow->Flags & 0x200U) != 0))
  {
    local_30 = FindHoveredWindow();
  }
  else {
    local_30 = GImGui->MovingWindow;
  }
  pIVar1->HoveredWindow = local_30;
  if (pIVar1->HoveredWindow == (ImGuiWindow *)0x0) {
    local_38 = (ImGuiWindow *)0x0;
  }
  else {
    local_38 = pIVar1->HoveredWindow->RootWindow;
  }
  pIVar1->HoveredRootWindow = local_38;
  potential_parent = GetFrontMostPopupModal();
  if (((potential_parent != (ImGuiWindow *)0x0) && (pIVar1->HoveredRootWindow != (ImGuiWindow *)0x0)
      ) && (bVar2 = IsWindowChildOf(pIVar1->HoveredRootWindow,potential_parent), !bVar2)) {
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
  }
  if (((pIVar1->IO).ConfigFlags & 0x10U) != 0) {
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
  }
  i = -1;
  bVar2 = false;
  for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
    if (((pIVar1->IO).MouseClicked[local_24] & 1U) != 0) {
      local_39 = 1;
      if (pIVar1->HoveredWindow == (ImGuiWindow *)0x0) {
        bVar3 = ImVector<ImGuiPopupRef>::empty(&pIVar1->OpenPopupStack);
        local_39 = bVar3 ^ 0xff;
      }
      (pIVar1->IO).MouseDownOwned[local_24] = (bool)(local_39 & 1);
    }
    bVar2 = bVar2 || ((pIVar1->IO).MouseDown[local_24] & 1U) != 0;
    if ((((pIVar1->IO).MouseDown[local_24] & 1U) != 0) &&
       ((i == -1 || ((pIVar1->IO).MouseClickedTime[local_24] < (pIVar1->IO).MouseClickedTime[i]))))
    {
      i = local_24;
    }
  }
  local_3a = 1;
  if (i != -1) {
    local_3a = (pIVar1->IO).MouseDownOwned[i];
  }
  bVar3 = false;
  if ((pIVar1->DragDropActive & 1U) != 0) {
    bVar3 = (pIVar1->DragDropSourceFlags & 0x10U) != 0;
  }
  if (((local_3a & 1) == 0) && (!bVar3)) {
    pIVar1->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar1->HoveredWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar1->WantCaptureMouseNextFrame == -1) {
    if (((local_3a & 1) == 0) ||
       ((local_3c = 1, pIVar1->HoveredWindow == (ImGuiWindow *)0x0 && (local_3c = 1, !bVar2)))) {
      bVar2 = ImVector<ImGuiPopupRef>::empty(&pIVar1->OpenPopupStack);
      local_3c = bVar2 ^ 0xff;
    }
    (pIVar1->IO).WantCaptureMouse = (bool)(local_3c & 1);
  }
  else {
    (pIVar1->IO).WantCaptureMouse = pIVar1->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar1->WantCaptureKeyboardNextFrame == -1) {
    local_3d = pIVar1->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
    (pIVar1->IO).WantCaptureKeyboard = local_3d;
  }
  else {
    (pIVar1->IO).WantCaptureKeyboard = pIVar1->WantCaptureKeyboardNextFrame != 0;
  }
  if (((((pIVar1->IO).NavActive & 1U) != 0) && (((pIVar1->IO).ConfigFlags & 1U) != 0)) &&
     (((pIVar1->IO).ConfigFlags & 8U) == 0)) {
    (pIVar1->IO).WantCaptureKeyboard = true;
  }
  if (pIVar1->WantTextInputNextFrame == -1) {
    local_3e = false;
  }
  else {
    local_3e = pIVar1->WantTextInputNextFrame != 0;
  }
  (pIVar1->IO).WantTextInput = local_3e;
  return;
}

Assistant:

void ImGui::NewFrameUpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    g.HoveredWindow = (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoInputs)) ? g.MovingWindow : FindHoveredWindow();
    g.HoveredRootWindow = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetFrontMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredRootWindow = g.HoveredWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to imgui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to imgui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}